

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

void maxHeapsort(HighsInt *heap_v,HighsInt *heap_i,HighsInt n)

{
  HighsInt HVar1;
  int in_EDX;
  HighsInt *in_RSI;
  HighsInt *in_RDI;
  HighsInt temp_i;
  HighsInt i;
  HighsInt temp_v;
  int local_1c;
  
  for (local_1c = in_EDX; 1 < local_1c; local_1c = local_1c + -1) {
    HVar1 = in_RDI[local_1c];
    in_RDI[local_1c] = in_RDI[1];
    in_RDI[1] = HVar1;
    HVar1 = in_RSI[local_1c];
    in_RSI[local_1c] = in_RSI[1];
    in_RSI[1] = HVar1;
    maxHeapify(in_RDI,in_RSI,1,local_1c + -1);
  }
  return;
}

Assistant:

void maxHeapsort(HighsInt* heap_v, HighsInt* heap_i, HighsInt n) {
  HighsInt temp_v;
  HighsInt i, temp_i;
  for (i = n; i >= 2; i--) {
    temp_v = heap_v[i];
    heap_v[i] = heap_v[1];
    heap_v[1] = temp_v;
    temp_i = heap_i[i];
    heap_i[i] = heap_i[1];
    heap_i[1] = temp_i;
    maxHeapify(heap_v, heap_i, 1, i - 1);
  }
}